

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

Status __thiscall
soplex::SPxSolverBase<double>::getPrimalSol
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  uint uVar1;
  Status *pSVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  DataKey DVar6;
  int iVar7;
  Status SVar8;
  ulong uVar9;
  SPxInternalCodeException *this_00;
  SPxStatusException *this_01;
  int j;
  long lVar10;
  ulong uVar11;
  pointer pdVar12;
  double dVar13;
  DataKey local_60;
  double local_58;
  string local_50;
  
  if (this->initialized == false) {
    SVar8 = status(this);
    if (SVar8 == NO_PROBLEM) {
      SVar8 = status(this);
      return SVar8;
    }
    this_01 = (SPxStatusException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_50,"XSOLVE06 Not Initialized",(allocator *)&local_60);
    SPxStatusException::SPxStatusException(this_01,&local_50);
    __cxa_throw(this_01,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  if (this->theRep == ROW) {
    VectorBase<double>::operator=(p_vector,&this->theCoPvec->super_VectorBase<double>);
  }
  else {
    uVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
            thenum;
    pSVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    pdVar3 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar11 = 0;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar11;
    }
    for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      pdVar12 = pdVar5;
      switch(pSVar2[uVar11]) {
      case D_FREE:
      case D_ON_UPPER:
      case D_ON_LOWER:
      case D_ON_BOTH:
      case D_UNDEFINED:
        goto switchD_0018a6a3_caseD_1;
      case P_FIXED:
      case P_ON_UPPER:
        pdVar12 = pdVar4;
      case P_ON_LOWER:
        dVar13 = pdVar12[uVar11];
        break;
      default:
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_50,"XSOLVE07 This should never happen.",(allocator *)&local_60);
        SPxInternalCodeException::SPxInternalCodeException(this_00,&local_50);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      case P_FREE:
        dVar13 = 0.0;
      }
      pdVar3[uVar11] = dVar13;
switchD_0018a6a3_caseD_1:
    }
    for (lVar10 = 0; lVar10 < (this->thecovectors->set).thenum; lVar10 = lVar10 + 1) {
      DVar6 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar10].super_DataKey;
      if (0 < DVar6.info) {
        local_58 = (this->theFvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
        local_60 = DVar6;
        SPxColId::SPxColId((SPxColId *)&local_50,(SPxId *)&local_60);
        iVar7 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                          (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                            super_SVSetBase<double>.set,(DataKey *)&local_50);
        (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7] = local_58;
      }
    }
  }
  SVar8 = status(this);
  return SVar8;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getPrimalSol(VectorBase<R>& p_vector) const
{

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE06 Not Initialized");
   }

   if(rep() == ROW)
      p_vector = coPvec();
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = SPxLPBase<R>::lower(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE07 This should never happen.");
         }
      }

      for(int j = 0; j < dim(); ++j)
      {
         if(this->baseId(j).isSPxColId())
            p_vector[ this->number(SPxColId(this->baseId(j))) ] = fVec()[j];
      }
   }

   return status();
}